

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetParser.cpp
# Opt level: O3

ArchKind __thiscall llvm::ARM::parseCPUArch(ARM *this,StringRef CPU)

{
  int iVar1;
  char *__n;
  long lVar2;
  
  __n = CPU.Data;
  lVar2 = 0x10;
  while ((*(char **)(&UNK_00239df8 + lVar2) != __n ||
         ((__n != (char *)0x0 &&
          (iVar1 = bcmp(this,*(void **)(&UNK_00239df0 + lVar2),(size_t)__n), iVar1 != 0))))) {
    lVar2 = lVar2 + 0x20;
    if (lVar2 == 0xa90) {
      return INVALID;
    }
  }
  return *(ArchKind *)((long)&(anonymous_namespace)::CPUNames + lVar2);
}

Assistant:

ARM::ArchKind llvm::ARM::parseCPUArch(StringRef CPU) {
  for (const auto C : CPUNames) {
    if (CPU == C.getName())
      return C.ArchID;
  }
  return ARM::ArchKind::INVALID;
}